

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

char * deGetSocketResultName(deSocketResult result)

{
  char *pcStack_10;
  deSocketResult result_local;
  
  switch(result) {
  case DE_SOCKETRESULT_SUCCESS:
    pcStack_10 = "DE_SOCKETRESULT_SUCCESS";
    break;
  case DE_SOCKETRESULT_WOULD_BLOCK:
    pcStack_10 = "DE_SOCKETRESULT_WOULD_BLOCK";
    break;
  case DE_SOCKETRESULT_CONNECTION_CLOSED:
    pcStack_10 = "DE_SOCKETRESULT_CONNECTION_CLOSED";
    break;
  case DE_SOCKETRESULT_CONNECTION_TERMINATED:
    pcStack_10 = "DE_SOCKETRESULT_CONNECTION_TERMINATED";
    break;
  case DE_SOCKETRESULT_ERROR:
    pcStack_10 = "DE_SOCKETRESULT_ERROR";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* deGetSocketResultName (deSocketResult result)
{
	switch (result)
	{
		case DE_SOCKETRESULT_SUCCESS:				return "DE_SOCKETRESULT_SUCCESS";
		case DE_SOCKETRESULT_WOULD_BLOCK:			return "DE_SOCKETRESULT_WOULD_BLOCK";
		case DE_SOCKETRESULT_CONNECTION_CLOSED:		return "DE_SOCKETRESULT_CONNECTION_CLOSED";
		case DE_SOCKETRESULT_CONNECTION_TERMINATED:	return "DE_SOCKETRESULT_CONNECTION_TERMINATED";
		case DE_SOCKETRESULT_ERROR:					return "DE_SOCKETRESULT_ERROR";
		default:									return DE_NULL;
	}
}